

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O0

int WebPReportProgress(WebPPicture *pic,int percent,int *percent_store)

{
  int iVar1;
  int *in_RDX;
  int in_ESI;
  WebPPicture *in_RDI;
  int local_4;
  
  if ((((in_RDX == (int *)0x0) || (in_ESI == *in_RDX)) ||
      (*in_RDX = in_ESI, in_RDI->progress_hook == (WebPProgressHook)0x0)) ||
     (iVar1 = (*in_RDI->progress_hook)(in_ESI,in_RDI), iVar1 != 0)) {
    local_4 = 1;
  }
  else {
    local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_USER_ABORT);
  }
  return local_4;
}

Assistant:

int WebPReportProgress(const WebPPicture* const pic,
                       int percent, int* const percent_store) {
  if (percent_store != NULL && percent != *percent_store) {
    *percent_store = percent;
    if (pic->progress_hook && !pic->progress_hook(percent, pic)) {
      // user abort requested
      return WebPEncodingSetError(pic, VP8_ENC_ERROR_USER_ABORT);
    }
  }
  return 1;  // ok
}